

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O0

_Bool glsl_attach_shader_source(ALLEGRO_SHADER *shader,ALLEGRO_SHADER_TYPE type,char *source)

{
  _Bool _Var1;
  GLuint GVar2;
  ALLEGRO_USTR *us;
  ALLEGRO_USTR *pAVar3;
  GLchar *in_RDX;
  int in_ESI;
  long in_RDI;
  GLenum gl_type;
  GLuint *handle;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_SHADER_GLSL_S *gl_shader;
  GLchar error_buf [4096];
  GLint status;
  undefined4 in_stack_ffffffffffffefb8;
  GLenum start_pos;
  GLchar local_1028 [32];
  char *in_stack_ffffffffffffeff8;
  int in_stack_fffffffffffff004;
  char *in_stack_fffffffffffff008;
  int in_stack_fffffffffffff014;
  char *in_stack_fffffffffffff018;
  int local_24;
  GLchar *local_20;
  int local_14;
  long local_10;
  _Bool local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  al_get_current_display();
  if (local_20 == (GLchar *)0x0) {
    if (local_14 == 1) {
      if (*(int *)(in_RDI + 0x50) != 0) {
        (*_al_glDetachShader)(*(GLuint *)(in_RDI + 0x58),*(GLuint *)(in_RDI + 0x50));
        (*_al_glDeleteShader)(*(GLuint *)(in_RDI + 0x50));
        *(undefined4 *)(in_RDI + 0x50) = 0;
      }
    }
    else if (*(int *)(in_RDI + 0x54) != 0) {
      (*_al_glDetachShader)(*(GLuint *)(in_RDI + 0x58),*(GLuint *)(in_RDI + 0x54));
      (*_al_glDeleteShader)(*(GLuint *)(in_RDI + 0x54));
      *(undefined4 *)(in_RDI + 0x54) = 0;
    }
    local_1 = true;
  }
  else {
    if (local_14 == 1) {
      us = (ALLEGRO_USTR *)(in_RDI + 0x50);
      start_pos = 0x8b31;
    }
    else {
      us = (ALLEGRO_USTR *)(in_RDI + 0x54);
      start_pos = 0x8b30;
    }
    GVar2 = (*_al_glCreateShader)(start_pos);
    us->mlen = GVar2;
    if (us->mlen == 0) {
      local_1 = false;
    }
    else {
      (*_al_glShaderSource)(us->mlen,1,&local_20,(GLint *)0x0);
      (*_al_glCompileShader)(us->mlen);
      (*_al_glGetShaderiv)(us->mlen,0x8b81,&local_24);
      if (local_24 == 0) {
        (*_al_glGetShaderInfoLog)(us->mlen,0x1000,(GLsizei *)0x0,local_1028);
        if (*(long *)(local_10 + 0x10) == 0) {
          pAVar3 = al_ustr_new((char *)0x2358db);
          *(ALLEGRO_USTR **)(local_10 + 0x10) = pAVar3;
        }
        else {
          al_ustr_truncate(us,start_pos);
          al_ustr_append_cstr(us,(char *)CONCAT44(start_pos,in_stack_ffffffffffffefb8));
        }
        _Var1 = _al_trace_prefix(in_stack_fffffffffffff018,in_stack_fffffffffffff014,
                                 in_stack_fffffffffffff008,in_stack_fffffffffffff004,
                                 in_stack_ffffffffffffeff8);
        if (_Var1) {
          _al_trace_suffix("Compile error: %s\n",local_1028);
        }
        (*_al_glDeleteShader)(us->mlen);
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

static bool glsl_attach_shader_source(ALLEGRO_SHADER *shader,
   ALLEGRO_SHADER_TYPE type, const char *source)
{
   GLint status;
   GLchar error_buf[4096];
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(display);
   ASSERT(display->flags & ALLEGRO_OPENGL);

   if (source == NULL) {
      if (type == ALLEGRO_VERTEX_SHADER) {
         if (gl_shader->vertex_shader) {
            glDetachShader(gl_shader->program_object, gl_shader->vertex_shader);
            glDeleteShader(gl_shader->vertex_shader);
            gl_shader->vertex_shader = 0;
         }
      }
      else {
         if (gl_shader->pixel_shader) {
            glDetachShader(gl_shader->program_object, gl_shader->pixel_shader);
            glDeleteShader(gl_shader->pixel_shader);
            gl_shader->pixel_shader = 0;
         }
      }
      return true;
   }
   else {
      GLuint *handle;
      GLenum gl_type;
      if (type == ALLEGRO_VERTEX_SHADER) {
         handle = &(gl_shader->vertex_shader);
         gl_type = GL_VERTEX_SHADER;
      }
      else {
         handle = &(gl_shader->pixel_shader);
         gl_type = GL_FRAGMENT_SHADER;
      }
      *handle = glCreateShader(gl_type);
      if ((*handle) == 0) {
         return false;
      }
      glShaderSource(*handle, 1, &source, NULL);
      glCompileShader(*handle);
      glGetShaderiv(*handle, GL_COMPILE_STATUS, &status);
      if (status == 0) {
         glGetShaderInfoLog(*handle, sizeof(error_buf), NULL, error_buf);
         if (shader->log) {
            al_ustr_truncate(shader->log, 0);
            al_ustr_append_cstr(shader->log, error_buf);
         }
         else {
            shader->log = al_ustr_new(error_buf);
         }
         ALLEGRO_ERROR("Compile error: %s\n", error_buf);
         glDeleteShader(*handle);
         return false;
      }
   }

   return true;
}